

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O0

size_t __thiscall avro::BinaryDecoder::skipArray(BinaryDecoder *this)

{
  size_t sVar1;
  StreamReader *in_RDI;
  size_t n;
  int64_t r;
  BinaryDecoder *in_stack_00000030;
  size_t in_stack_ffffffffffffffd8;
  
  while( true ) {
    sVar1 = doDecodeLong(in_stack_00000030);
    if (-1 < (long)sVar1) break;
    doDecodeLong(in_stack_00000030);
    StreamReader::skipBytes(in_RDI,in_stack_ffffffffffffffd8);
  }
  return sVar1;
}

Assistant:

size_t BinaryDecoder::skipArray()
{
    for (; ;) {
        int64_t r = doDecodeLong();
        if (r < 0) {
            size_t n = static_cast<size_t>(doDecodeLong()); 
            in_.skipBytes(n);
        } else {
            return static_cast<size_t>(r);
        }
    }
}